

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_gen.h
# Opt level: O2

void __thiscall
IntegerRandomGenerator::IntegerRandomGenerator
          (IntegerRandomGenerator *this,vector<double,_std::allocator<double>_> *distribution,
          vector<int,_std::allocator<int>_> *values)

{
  pointer pdVar1;
  pointer piVar2;
  invalid_argument *this_00;
  pointer piVar3;
  iterator __begin2;
  pointer pdVar4;
  int x_i;
  double p_i;
  
  (this->mValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->mValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->mValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->mDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pdVar4 = (distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (distribution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pdVar1 - (long)pdVar4 >> 3 ==
      (long)(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start >> 2) {
    for (; pdVar4 != pdVar1; pdVar4 = pdVar4 + 1) {
      p_i = *pdVar4;
      std::vector<double,_std::allocator<double>_>::push_back(&this->mDist,&p_i);
    }
    piVar2 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    for (piVar3 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start; piVar3 != piVar2; piVar3 = piVar3 + 1) {
      x_i = *piVar3;
      std::vector<int,_std::allocator<int>_>::push_back(&this->mValues,&x_i);
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"distribution and values vectors shall have the same length");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

IntegerRandomGenerator(std::vector<double> distribution, std::vector<int> values)
    {
        size_t size_dist = distribution.size();
        size_t size_val  = values.size();
        if( size_dist != size_val )
        {
            throw std::invalid_argument("distribution and values vectors shall have the same length");
        }
        else
        {
            for( double p_i : distribution )
            {
                mDist.push_back(p_i);
            }
            for( int x_i : values )
            {
                mValues.push_back(x_i);
            }
        }
    }